

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall asmjit::BaseRAPass::_dumpBlockIds(BaseRAPass *this,String *sb,RABlocks *blocks)

{
  uint uVar1;
  Error EVar2;
  undefined8 in_RAX;
  RABlock **ppRVar3;
  uint *args;
  char *fmt;
  size_t i;
  undefined8 local_38;
  
  uVar1 = (blocks->super_ZoneVectorBase)._size;
  i = 0;
  local_38 = in_RAX;
  while( true ) {
    if (uVar1 == i) {
      return 0;
    }
    ppRVar3 = ZoneVector<asmjit::RABlock_*>::operator[](blocks,i);
    if (i == 0) {
      local_38 = CONCAT44(local_38._4_4_,(*ppRVar3)->_blockId);
      fmt = "#%u";
      args = (uint *)&local_38;
    }
    else {
      local_38 = CONCAT44((*ppRVar3)->_blockId,(uint)local_38);
      fmt = ", #%u";
      args = (uint *)((long)&local_38 + 4);
    }
    EVar2 = String::appendFormat<unsigned_int>(sb,fmt,args);
    if (EVar2 != 0) break;
    i = i + 1;
  }
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseRAPass::_dumpBlockIds(String& sb, const RABlocks& blocks) noexcept {
  for (uint32_t i = 0, size = blocks.size(); i < size; i++) {
    const RABlock* block = blocks[i];
    if (i != 0)
      ASMJIT_PROPAGATE(sb.appendFormat(", #%u", block->blockId()));
    else
      ASMJIT_PROPAGATE(sb.appendFormat("#%u", block->blockId()));
  }
  return kErrorOk;
}